

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O0

CordRepFlat * absl::lts_20240722::cord_internal::CordRepFlat::NewImpl<4096ul>(size_t len)

{
  uint8_t uVar1;
  size_t size_00;
  CordRepFlat *this;
  CordRepFlat *rep;
  void *raw_rep;
  size_t size;
  size_t len_local;
  
  if (len < 0x14) {
    size = 0x13;
  }
  else {
    size = len;
    if (0xff3 < len) {
      size = 0xff3;
    }
  }
  size_00 = RoundUpForTag(size + 0xd);
  this = (CordRepFlat *)operator_new(size_00);
  memset(this,0,0x10);
  CordRepFlat(this);
  uVar1 = AllocatedSizeToTag(size_00);
  (this->super_CordRep).tag = uVar1;
  return this;
}

Assistant:

static CordRepFlat* NewImpl(size_t len, Args... args ABSL_ATTRIBUTE_UNUSED) {
    if (len <= kMinFlatLength) {
      len = kMinFlatLength;
    } else if (len > max_flat_size - kFlatOverhead) {
      len = max_flat_size - kFlatOverhead;
    }

    // Round size up so it matches a size we can exactly express in a tag.
    const size_t size = RoundUpForTag(len + kFlatOverhead);
    void* const raw_rep = ::operator new(size);
    // GCC 13 has a false-positive -Wstringop-overflow warning here.
    #if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(13, 0)
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wstringop-overflow"
    #endif
    CordRepFlat* rep = new (raw_rep) CordRepFlat();
    rep->tag = AllocatedSizeToTag(size);
    #if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(13, 0)
    #pragma GCC diagnostic pop
    #endif
    return rep;
  }